

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relation.cpp
# Opt level: O0

Relation * __thiscall Relation::toString_abi_cxx11_(Relation *this)

{
  bool bVar1;
  reference pTVar2;
  long in_RSI;
  Tuple local_80;
  undefined1 local_60 [8];
  Tuple t;
  iterator __end1;
  iterator __begin1;
  set<Tuple,_tupleCompare,_std::allocator<Tuple>_> *__range1;
  allocator local_1a;
  undefined1 local_19;
  Relation *this_local;
  string *res;
  
  local_19 = 0;
  this_local = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)this,"",&local_1a);
  std::allocator<char>::~allocator((allocator<char> *)&local_1a);
  __end1 = std::set<Tuple,_tupleCompare,_std::allocator<Tuple>_>::begin
                     ((set<Tuple,_tupleCompare,_std::allocator<Tuple>_> *)(in_RSI + 0x18));
  t.data.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)std::set<Tuple,_tupleCompare,_std::allocator<Tuple>_>::end
                          ((set<Tuple,_tupleCompare,_std::allocator<Tuple>_> *)(in_RSI + 0x18));
  while (bVar1 = std::operator!=(&__end1,(_Self *)&t.data.
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                ), bVar1) {
    pTVar2 = std::_Rb_tree_const_iterator<Tuple>::operator*(&__end1);
    Tuple::Tuple((Tuple *)local_60,pTVar2);
    std::__cxx11::string::operator+=((string *)this,"  ");
    Tuple::namedToString
              (&local_80,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_60);
    std::__cxx11::string::operator+=((string *)this,(string *)&local_80);
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::operator+=((string *)this,"\n");
    Tuple::~Tuple((Tuple *)local_60);
    std::_Rb_tree_const_iterator<Tuple>::operator++(&__end1);
  }
  return this;
}

Assistant:

string Relation::toString()
{
 string res = "";
 // res += tuple_to_string(columns);
 // res += "\n";
 for (auto t: tuples)
 {
   res += "  ";
   res += t.namedToString(columns);
   res += "\n";
 }
 return res;
}